

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::dh_key_exchange::compute_secret(dh_key_exchange *this,key_t *remote_pubkey)

{
  uchar *out;
  hasher *this_00;
  number<boost::multiprecision::backends::cpp_int_backend<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R8;
  span<const_char> local_128;
  span<const_char> local_118;
  hasher local_108;
  sha1_hash local_fc;
  undefined1 local_e8 [8];
  array<char,_96UL> buffer;
  key_t *remote_pubkey_local;
  dh_key_exchange *this_local;
  
  boost::multiprecision::
  powm<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<768u,768u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<768u,768u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<768u,768u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>>
            ((type *)(buffer._M_elems + 0x58),(multiprecision *)remote_pubkey,
             &this->m_dh_local_secret,
             (number<boost::multiprecision::backends::cpp_int_backend<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(anonymous_namespace)::dh_prime,in_R8);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  ::operator=(&this->m_dh_shared_secret,
              (number<boost::multiprecision::backends::cpp_int_backend<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
               *)(buffer._M_elems + 0x58));
  out = (uchar *)::std::array<char,_96UL>::data((array<char,_96UL> *)local_e8);
  boost::multiprecision::
  export_bits<768u,768u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_char*>
            (&this->m_dh_shared_secret,out,8,true);
  span<char_const>::span<char_const,4l>((span<char_const> *)&local_118,(char (*) [4])"req3");
  lcrypto::hasher::hasher(&local_108,local_118);
  span<char_const>::span<char,96ul>((span<char_const> *)&local_128,(array<char,_96UL> *)local_e8);
  this_00 = lcrypto::hasher::update(&local_108,local_128);
  lcrypto::hasher::final(&local_fc,this_00);
  *(undefined8 *)(this->m_xor_mask).m_number._M_elems = local_fc.m_number._M_elems._0_8_;
  *(undefined8 *)((this->m_xor_mask).m_number._M_elems + 2) = local_fc.m_number._M_elems._8_8_;
  (this->m_xor_mask).m_number._M_elems[4] = local_fc.m_number._M_elems[4];
  lcrypto::hasher::~hasher(&local_108);
  return;
}

Assistant:

void dh_key_exchange::compute_secret(key_t const& remote_pubkey)
	{
		// shared_secret = (remote_pubkey ^ local_secret) % prime
		m_dh_shared_secret = mp::powm(remote_pubkey, m_dh_local_secret, dh_prime);

		std::array<char, 96> buffer;
		mp::export_bits(m_dh_shared_secret, reinterpret_cast<std::uint8_t*>(buffer.data()), 8);

		static char const req3[4] = {'r', 'e', 'q', '3'};
		// calculate the xor mask for the obfuscated hash
		m_xor_mask = hasher(req3).update(buffer).final();
	}